

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool __thiscall cmake::SaveCache(cmake *this,string *path)

{
  bool bVar1;
  long lVar2;
  allocator<char> local_51;
  string local_50;
  
  bVar1 = cmState::SaveCache(this->State,path,this->Messenger);
  lVar2 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               *(char **)((long)&SaveCache(std::__cxx11::string_const&)::entries + lVar2),&local_51)
    ;
    UnwatchUnusedCli(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  return bVar1;
}

Assistant:

bool cmake::SaveCache(const std::string& path)
{
  bool result = this->State->SaveCache(path, this->GetMessenger());
  static const auto entries = { "CMAKE_CACHE_MAJOR_VERSION",
                                "CMAKE_CACHE_MINOR_VERSION",
                                "CMAKE_CACHE_PATCH_VERSION",
                                "CMAKE_CACHEFILE_DIR" };
  for (auto const& entry : entries) {
    this->UnwatchUnusedCli(entry);
  }
  return result;
}